

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

uint GetSplitCopyCount(VmInstruction *inst,uint marker)

{
  long lVar1;
  VmValue **ppVVar2;
  VmInstruction *pVVar3;
  uint uVar4;
  VmInstructionType VVar5;
  VmValue *pVVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  VmInstruction *pVVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  
  if (inst->regVmSearchMarker == marker) {
    return 0;
  }
  inst->regVmSearchMarker = marker;
  VVar5 = inst->cmd;
  uVar13 = 0;
  if (VVar5 == VM_INST_PHI) {
    if ((inst->arguments).count == 0) {
      uVar13 = 0;
      goto LAB_001a39e5;
    }
    uVar13 = 0;
    uVar12 = 0;
    do {
      pVVar10 = (VmInstruction *)(inst->arguments).data[uVar12];
      if ((pVVar10 == (VmInstruction *)0x0) || ((pVVar10->super_VmValue).typeID != 2)) {
        pVVar10 = (VmInstruction *)0x0;
      }
      uVar4 = GetSplitCopyCount(pVVar10,marker);
      uVar13 = uVar13 + uVar4;
      uVar4 = (int)uVar12 + 2;
      uVar12 = (ulong)uVar4;
    } while (uVar4 < (inst->arguments).count);
    VVar5 = inst->cmd;
  }
  if (VVar5 == VM_INST_MOV) {
    if ((inst->arguments).count == 0) {
LAB_001a3b47:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    pVVar6 = *(inst->arguments).data;
    if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 2)) {
      pVVar6 = (VmValue *)0x0;
    }
    if (inst->color != 0) {
      uVar13 = uVar13 + (inst->color == *(uint *)(pVVar6[1].users.little + 7));
    }
  }
  else if ((VVar5 == VM_INST_DEF) &&
          (uVar12 = (ulong)(inst->super_VmValue).users.count, uVar12 != 0)) {
    uVar7 = 0;
    do {
      pVVar6 = (inst->super_VmValue).users.data[uVar7];
      if ((((pVVar6 != (VmValue *)0x0) && (pVVar6->typeID == 2)) &&
          (*(int *)&pVVar6[1]._vptr_VmValue == 0x51)) &&
         (uVar8 = (ulong)pVVar6[1].type.type, uVar8 != 0)) {
        uVar9 = 1;
        do {
          pVVar10 = *(VmInstruction **)(*(long *)&pVVar6[1].typeID + -8 + uVar9 * 8);
          if ((pVVar10 == (VmInstruction *)0x0) || ((pVVar10->super_VmValue).typeID != 2)) {
            pVVar10 = (VmInstruction *)0x0;
          }
          if (uVar8 <= uVar9) goto LAB_001a3b47;
          lVar1 = *(long *)(*(long *)&pVVar6[1].typeID + uVar9 * 8);
          if ((lVar1 == 0) || (*(int *)(lVar1 + 8) != 2)) {
            if (pVVar10 != (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c94,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
LAB_001a3b8a:
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1c93,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
          }
          if (pVVar10 == (VmInstruction *)0x0) goto LAB_001a3b8a;
          if ((pVVar10 == inst) && (inst->color != 0)) {
            uVar13 = uVar13 + (inst->color == *(uint *)(lVar1 + 0x120));
          }
          uVar11 = uVar9 + 1;
          uVar9 = uVar9 + 2;
        } while (uVar11 < uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar12);
  }
LAB_001a39e5:
  if ((inst->super_VmValue).users.count != 0) {
    uVar12 = 0;
    do {
      pVVar10 = (VmInstruction *)(inst->super_VmValue).users.data[uVar12];
      if ((pVVar10 == (VmInstruction *)0x0) || ((pVVar10->super_VmValue).typeID != 2)) {
        pVVar10 = (VmInstruction *)0x0;
      }
      VVar5 = pVVar10->cmd;
      if (VVar5 == VM_INST_PHI) {
        uVar4 = GetSplitCopyCount(pVVar10,marker);
        uVar13 = uVar13 + uVar4;
        VVar5 = pVVar10->cmd;
      }
      if (VVar5 == VM_INST_MOV) {
        if ((pVVar10->arguments).count == 0) goto LAB_001a3b47;
        if ((VmInstruction *)*(pVVar10->arguments).data != inst) {
          __assert_fail("inst == instruction->arguments[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1ca9,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
        }
        if (pVVar10->color != 0) {
          uVar13 = uVar13 + (pVVar10->color == inst->color);
        }
      }
      else if ((VVar5 == VM_INST_PARALLEL_COPY) &&
              (uVar7 = (ulong)(pVVar10->arguments).count, uVar7 != 0)) {
        ppVVar2 = (pVVar10->arguments).data;
        uVar8 = 1;
        do {
          pVVar6 = ppVVar2[uVar8 - 1];
          if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 2)) {
            pVVar6 = (VmValue *)0x0;
          }
          if (uVar7 <= uVar8) goto LAB_001a3b47;
          pVVar3 = (VmInstruction *)ppVVar2[uVar8];
          if ((pVVar3 == (VmInstruction *)0x0) || ((pVVar3->super_VmValue).typeID != 2)) {
            if (pVVar6 != (VmValue *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1cb7,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
LAB_001a3b28:
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1cb6,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
          }
          if (pVVar6 == (VmValue *)0x0) goto LAB_001a3b28;
          if ((pVVar3 == inst) && (pVVar10->color != 0)) {
            uVar13 = uVar13 + (pVVar10->color == *(uint *)(pVVar6[1].users.little + 7));
          }
          uVar9 = uVar8 + 1;
          uVar8 = uVar8 + 2;
        } while (uVar9 < uVar7);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (inst->super_VmValue).users.count);
  }
  return uVar13;
}

Assistant:

unsigned GetSplitCopyCount(VmInstruction *inst, unsigned marker)
{
	if(inst->regVmSearchMarker == marker)
		return 0;

	inst->regVmSearchMarker = marker;

	unsigned count = 0;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			count += GetSplitCopyCount(instruction, marker);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		if(inst->color != 0 && inst->color == instruction->color)
			count++;
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
					{
						if(inst->color != 0 && inst->color == source->color)
							count++;
					}
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			count += GetSplitCopyCount(instruction, marker);

		if(instruction->cmd == VM_INST_MOV)
		{
			assert(inst == instruction->arguments[0]);

			if(instruction->color != 0 && instruction->color == inst->color)
				count++;
		}

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
				{
					if(instruction->color != 0 && instruction->color == destination->color)
						count++;
				}
			}
		}
	}

	return count;
}